

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O2

void __thiscall RenX_MedalsPlugin::~RenX_MedalsPlugin(RenX_MedalsPlugin *this)

{
  ~RenX_MedalsPlugin(this);
  operator_delete(this,0x220);
  return;
}

Assistant:

RenX_MedalsPlugin::~RenX_MedalsPlugin()
{
	RenX::Core *core = RenX::getCore();
	size_t sCount = core->getServerCount();
	RenX::Server *server;

	for (size_t i = 0; i < sCount; i++) {
		server = core->getServer(i);
		if (server->players.size() != 0) {
			for (auto node = server->players.begin(); node != server->players.end(); ++node) {
				if (!node->uuid.empty() && !node->isBot) {
					RenX_MedalsPlugin::medalsFile[node->uuid].set("Recs"sv, node->varData[this->getName()].get("Recs"sv, ""s));
					RenX_MedalsPlugin::medalsFile[node->uuid].set("Noobs"sv, node->varData[this->getName()].get("Noobs"sv, ""s));
				}
			}
		}
	}

	RenX_MedalsPlugin::medalsFile.write(RenX_MedalsPlugin::medalsFileName);
}